

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O3

void XUtf8DrawString(Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int x,int y,
                    char *string,int num_bytes)

{
  uint uVar1;
  XFontStruct **ppXVar2;
  uint ucs_00;
  Display *pDVar3;
  GC p_Var4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint ucs;
  XChar2b buf [128];
  undefined2 local_19a;
  int local_198;
  unsigned_short local_192;
  int local_190;
  uint local_18c;
  int local_188;
  uint local_184;
  ulong local_180;
  Display *local_178;
  Drawable local_170;
  GC local_168;
  long local_160;
  int local_154;
  uchar *local_150;
  int *local_148;
  int *local_140;
  undefined2 local_138 [132];
  
  uVar1 = font_set->nb_font;
  if ((int)uVar1 < 1) {
    return;
  }
  local_148 = font_set->ranges;
  local_140 = font_set->encodings;
  ppXVar2 = font_set->fonts;
  uVar10 = 0;
  while (ppXVar2[uVar10] == (XFontStruct *)0x0) {
    uVar10 = uVar10 + 1;
    if (uVar1 == uVar10) {
      return;
    }
  }
  uVar9 = 0;
  iVar11 = (int)uVar10;
  local_190 = y;
  local_178 = display;
  local_170 = d;
  local_168 = gc;
  if (0 < num_bytes) {
    uVar12 = uVar10 & 0xffffffff;
    local_198 = x;
    do {
      p_Var4 = local_168;
      pDVar3 = local_178;
      local_154 = (int)uVar12;
      local_160 = (long)local_154;
      local_180 = uVar9;
      local_150 = (uchar *)string;
      if (0x78 < (int)uVar9) {
        XSetFont(local_178,local_168,ppXVar2[local_160]->fid);
        iVar11 = local_198;
        XDrawString16(pDVar3,local_170,p_Var4,local_198,local_190,local_138,(int)local_180);
        local_198 = XTextWidth16(ppXVar2[local_160],local_138,local_180);
        local_198 = iVar11 + local_198;
        local_180 = 0;
      }
      uVar5 = XFastConvertUtf8ToUcs(local_150,num_bytes,&local_184);
      if ((int)uVar5 < 2) {
        uVar5 = 1;
      }
      local_192 = XUtf8IsNonSpacing(local_184);
      if (local_192 != 0) {
        local_184 = (uint)local_192;
      }
      ucs_00 = local_184;
      uVar12 = uVar10;
      local_18c = uVar5;
      local_188 = num_bytes;
      if ((int)uVar10 < (int)uVar1) {
        do {
          if (ppXVar2[uVar12] != (XFontStruct *)0x0) {
            iVar11 = local_140[uVar12];
            iVar6 = ucs2fontmap((char *)&local_19a,ucs_00,iVar11);
            if ((-1 < iVar6) &&
               ((iVar11 != 0 ||
                ((local_148[uVar12 * 2] <= (int)ucs_00 && ((int)ucs_00 <= local_148[uVar12 * 2 + 1])
                 ))))) goto LAB_001a5a0e;
          }
          uVar12 = uVar12 + 1;
        } while (uVar1 != uVar12);
LAB_001a5a13:
        ucs2fontmap((char *)&local_19a,0x3f,local_140[uVar10]);
        uVar12 = uVar10 & 0xffffffff;
      }
      else {
        uVar12 = uVar10 & 0xffffffff;
LAB_001a5a0e:
        if ((uint)uVar12 == uVar1) goto LAB_001a5a13;
      }
      p_Var4 = local_168;
      pDVar3 = local_178;
      iVar11 = (int)uVar12;
      if ((local_192 == 0) && (local_154 == iVar11)) {
        local_138[(int)local_180] = local_19a;
        uVar9 = (ulong)((int)local_180 + 1);
      }
      else {
        XSetFont(local_178,local_168,ppXVar2[local_160]->fid);
        iVar6 = local_198;
        XDrawString16(pDVar3,local_170,p_Var4,local_198,local_190,local_138,(int)local_180);
        iVar7 = XTextWidth16(ppXVar2[local_160],local_138,local_180);
        local_138[0] = local_19a;
        if (local_192 == 0) {
          uVar9 = 1;
          local_198 = iVar7 + iVar6;
        }
        else {
          iVar8 = XTextWidth16(ppXVar2[iVar11],local_138,1);
          uVar9 = 1;
          local_198 = (iVar7 + iVar6) - iVar8;
        }
      }
      string = (char *)(local_150 + local_18c);
      num_bytes = local_188 - local_18c;
      x = local_198;
    } while (num_bytes != 0 && (int)local_18c <= local_188);
  }
  p_Var4 = local_168;
  pDVar3 = local_178;
  XSetFont(local_178,local_168,ppXVar2[iVar11]->fid);
  XDrawString16(pDVar3,local_170,p_Var4,x,local_190,local_138,(int)uVar9);
  return;
}

Assistant:

void
XUtf8DrawString(Display 	*display,
	        Drawable 	d,
                XUtf8FontStruct *font_set,
	        GC 		gc,
	        int 		x,
	        int 		y,
	        const char	*string,
                int 		num_bytes) {

  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }
  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      XDrawString16(display, d, gc, x, y, buf, i);
      x += XTextWidth16(fonts[fnum], buf, i);
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      XDrawString16(display, d, gc, x, y, buf, i);
      x += XTextWidth16(fonts[last_fnum], buf, i);
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	x -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  XSetFont(display, gc, fonts[fnum]->fid);
  XDrawString16(display, d, gc, x, y, buf, i);
}